

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventAgent.h
# Opt level: O0

ssize_t __thiscall
SyncRetEventAgent<int>::send
          (SyncRetEventAgent<int> *this,int __fd,void *__buf,size_t __n,int __flags)

{
  uint uVar1;
  undefined4 in_register_00000034;
  SmartPtr<EventAgent> local_20;
  SmartPtr<EventAgent> holdMe;
  IEventDispatcher *dispatcher_local;
  SyncRetEventAgent<int> *this_local;
  
  holdMe.mObj = (EventAgent *)CONCAT44(in_register_00000034,__fd);
  SmartPtr<EventAgent>::SmartPtr(&local_20,(EventAgent *)this);
  uVar1 = (*((holdMe.mObj)->super_Event).super_RefCount._vptr_RefCount[7])();
  if ((uVar1 & 1) == 0) {
    (**((holdMe.mObj)->super_Event).super_RefCount._vptr_RefCount)(holdMe.mObj,this);
  }
  else {
    (**(code **)(*(long *)this + 0x18))();
  }
  uVar1 = this->mRetValue;
  SmartPtr<EventAgent>::~SmartPtr(&local_20);
  return (ulong)uVar1;
}

Assistant:

ReturnType send(IEventDispatcher *dispatcher)
	{
		// The SyncRetEventAgent needs to make sure that after it
		// is dispatched and delivered the agent remains valid until
		// we are ready to return the value we filled in in the deliver
		// method.   In this case though we are going to use the
		// SmartPtr<> template and C++ scoping to do the AddRef and
		// Release so that we can return mRetValue directly without
		// making an explicit copy on the stack.
		
		// This is necessary because as soon as the dispatcher->sendEventSync
		// returns the only gauranteed reference to "this" object is the
		// one that is taken in this method.   Once we release that reference
		// "this" is possibly invalid and should not be accessed by again
		// before the method returns.
		
		SmartPtr<EventAgent> holdMe = this;
		
		if (dispatcher->isThreadCurrent())
		{
			deliver();
		}
		else
		{
			dispatcher->sendEventSync(this);
		}
		
		// Return the filled in return value.   This will make
		// an appropriate copy of mRetValue before the SmartPtr<>
		// falls out of scope and releases this object.
		return mRetValue;
	}